

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void fetchTransformedBilinearARGB32PM_downscale_helper<(TextureBlendType)4>
               (uint *b,uint *end,QTextureData *image,int *fx,int *fy,int fdx,int param_7)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined1 auVar17 [16];
  uint uVar18;
  uint uVar19;
  int iVar20;
  uchar *puVar21;
  uchar *puVar22;
  uint **ppuVar23;
  int iVar24;
  uint *in_RCX;
  int iVar25;
  QTextureData *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  uint *in_R8;
  int in_R9D;
  long in_FS_OFFSET;
  short sVar26;
  uint uVar27;
  short sVar34;
  short sVar37;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  short sVar35;
  uint uVar36;
  short sVar38;
  uint uVar39;
  short sVar45;
  uint uVar46;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  short sVar44;
  short sVar47;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  int distx8_1;
  uint br_1;
  uint bl_1;
  uint tr_1;
  uint tl_1;
  int distx8;
  int x;
  __m128i rRB;
  __m128i rAG;
  __m128i brRB;
  __m128i brAG;
  __m128i blRB;
  __m128i blAG;
  __m128i trRB;
  __m128i trAG;
  __m128i tlRB;
  __m128i tlAG;
  __m128i idxdy;
  __m128i dxidy;
  __m128i idxidy;
  __m128i disty_;
  __m128i distx_;
  __m128i dxdy;
  __m128i v_distx;
  __m128i br;
  __m128i bl;
  __m128i tr;
  __m128i tl;
  int offset3;
  int offset2;
  int offset1;
  int offset0;
  __m128i offset;
  __m128i v_fx;
  __m128i v_fx_r;
  __m128i v_fdx;
  __m128i v_disty;
  __m128i v_256;
  __m128i colorMask;
  uint bot;
  uint top;
  qint64 max_fx;
  qint64 min_fx;
  int disty4;
  int disty8;
  uint *s2;
  uint *s1;
  int x2_1;
  int x1_1;
  uint *boundedEnd;
  int x2;
  int x1;
  int y2;
  int y1;
  ulong *in_stack_fffffffffffff648;
  ulong *in_stack_fffffffffffff650;
  uint in_stack_fffffffffffff658;
  undefined4 in_stack_fffffffffffff65c;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined1 local_888 [16];
  undefined8 local_818;
  undefined8 uStack_810;
  short local_798;
  ulong *local_758;
  ushort local_718;
  ushort uStack_716;
  ushort uStack_714;
  ushort uStack_712;
  ushort uStack_710;
  ushort uStack_70e;
  ushort uStack_70c;
  ushort uStack_70a;
  ushort local_6f8;
  ushort uStack_6f6;
  ushort uStack_6f4;
  ushort uStack_6f2;
  ushort uStack_6f0;
  ushort uStack_6ee;
  ushort uStack_6ec;
  ushort uStack_6ea;
  ushort local_6d8;
  ushort uStack_6d6;
  ushort uStack_6d4;
  ushort uStack_6d2;
  ushort uStack_6d0;
  ushort uStack_6ce;
  ushort uStack_6cc;
  ushort uStack_6ca;
  ushort local_6b8;
  ushort uStack_6b6;
  ushort uStack_6b4;
  ushort uStack_6b2;
  ushort uStack_6b0;
  ushort uStack_6ae;
  ushort uStack_6ac;
  ushort uStack_6aa;
  ushort local_698;
  ushort uStack_696;
  ushort uStack_694;
  ushort uStack_692;
  ushort uStack_690;
  ushort uStack_68e;
  ushort uStack_68c;
  ushort uStack_68a;
  ushort local_678;
  ushort uStack_676;
  ushort uStack_674;
  ushort uStack_672;
  ushort uStack_670;
  ushort uStack_66e;
  ushort uStack_66c;
  ushort uStack_66a;
  short local_5d8;
  short sStack_5d6;
  short sStack_5d4;
  short sStack_5d2;
  short sStack_5d0;
  short sStack_5ce;
  short sStack_5cc;
  short sStack_5ca;
  short local_598;
  short sStack_596;
  short sStack_594;
  short sStack_592;
  short sStack_590;
  short sStack_58e;
  short sStack_58c;
  short sStack_58a;
  short local_558;
  short sStack_556;
  short sStack_554;
  short sStack_552;
  short sStack_550;
  short sStack_54e;
  short sStack_54c;
  short sStack_54a;
  short local_518;
  short sStack_516;
  short sStack_514;
  short sStack_512;
  short sStack_510;
  short sStack_50e;
  short sStack_50c;
  short sStack_50a;
  short local_4d8;
  short sStack_4d6;
  short sStack_4d4;
  short sStack_4d2;
  short sStack_4d0;
  short sStack_4ce;
  short sStack_4cc;
  short sStack_4ca;
  short local_3e8;
  short sStack_3e6;
  short sStack_3e4;
  short sStack_3e2;
  short sStack_3e0;
  short sStack_3de;
  short sStack_3dc;
  short sStack_3da;
  short local_3d8;
  short sStack_3d6;
  short sStack_3d4;
  short sStack_3d2;
  short sStack_3d0;
  short sStack_3ce;
  short sStack_3cc;
  short sStack_3ca;
  uint local_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  undefined4 uStack_74;
  undefined4 uStack_6c;
  int local_38;
  int local_34;
  uint *local_30;
  uint *local_28;
  ulong *local_20;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = (int)*in_R8 >> 0x10;
  local_10 = -0x55555556;
  fetchTransformedBilinear_pixelBounds<(TextureBlendType)4>
            (in_RDX->height,in_RDX->y1,in_RDX->y2 + -1,&local_c,&local_10);
  puVar21 = QTextureData::scanLine(in_RDX,local_c);
  puVar22 = QTextureData::scanLine(in_RDX,local_10);
  uVar18 = (int)(*in_R8 & 0xffff) >> 8;
  iVar20 = in_RDX->x1;
  iVar24 = in_RDX->x2;
  for (local_758 = in_RDI; local_758 < in_RSI; local_758 = (ulong *)((long)local_758 + 4)) {
    local_14 = (int)*in_RCX >> 0x10;
    local_18 = -0x55555556;
    fetchTransformedBilinear_pixelBounds<(TextureBlendType)4>
              (in_RDX->width,in_RDX->x1,in_RDX->x2 + -1,&local_14,&local_18);
    if (local_14 != local_18) break;
    uVar19 = INTERPOLATE_PIXEL_256
                       (*(uint *)(puVar21 + (long)local_14 * 4),0x100 - uVar18,
                        *(uint *)(puVar22 + (long)local_14 * 4),uVar18);
    *(uint *)local_758 = uVar19;
    *in_RCX = in_R9D + *in_RCX;
  }
  if (in_R9D < 1) {
    local_20 = in_RSI;
    if (in_R9D < 0) {
      local_30 = (uint *)((long)local_758 +
                         (((long)iVar20 * 0x10000 - (long)(int)*in_RCX) / (long)in_R9D) * 4);
      in_stack_fffffffffffff648 = local_758;
      ppuVar23 = qMin<unsigned_int*>((uint **)&local_20,&local_30);
      local_20 = (ulong *)*ppuVar23;
    }
  }
  else {
    local_28 = (uint *)((long)local_758 +
                       (((long)(iVar24 + -1) * 0x10000 - (long)(int)*in_RCX) / (long)in_R9D) * 4);
    in_stack_fffffffffffff650 = local_758;
    ppuVar23 = qMin<unsigned_int*>((uint **)&local_20,&local_28);
    local_20 = (ulong *)*ppuVar23;
  }
  local_798 = (short)((int)(uVar18 + 8) >> 4);
  auVar17._2_2_ = local_798;
  auVar17._0_2_ = local_798;
  auVar17._4_2_ = local_798;
  auVar17._6_2_ = local_798;
  auVar17._10_2_ = local_798;
  auVar17._8_2_ = local_798;
  auVar17._12_2_ = local_798;
  auVar17._14_2_ = local_798;
  iVar20 = in_R9D * 4;
  iVar25 = *in_RCX + in_R9D;
  iVar24 = iVar25 + in_R9D;
  local_818 = CONCAT44(iVar25,*in_RCX);
  uStack_810 = CONCAT44(iVar24 + in_R9D,iVar24);
  for (; local_2f8 = (uint)local_818, local_758 < (ulong *)((long)local_20 + -0xc);
      local_758 = local_758 + 2) {
    uStack_2f4 = (uint)((ulong)local_818 >> 0x20);
    uStack_2f0 = (uint)uStack_810;
    uStack_2ec = (uint)((ulong)uStack_810 >> 0x20);
    uVar27 = local_2f8 >> 0x10;
    uVar36 = uStack_2f4 >> 0x10;
    uVar39 = uStack_2f0 >> 0x10;
    uVar46 = uStack_2ec >> 0x10;
    uVar1 = *(undefined4 *)(puVar21 + (long)(int)uVar27 * 4);
    uVar2 = *(undefined4 *)(puVar21 + (long)(int)uVar36 * 4);
    uVar3 = *(undefined4 *)(puVar21 + (long)(int)uVar39 * 4);
    uVar4 = *(undefined4 *)(puVar21 + (long)(int)uVar46 * 4);
    uVar5 = *(undefined4 *)(puVar21 + (long)(int)uVar27 * 4 + 4);
    uVar6 = *(undefined4 *)(puVar21 + (long)(int)uVar36 * 4 + 4);
    uVar7 = *(undefined4 *)(puVar21 + (long)(int)uVar39 * 4 + 4);
    uVar8 = *(undefined4 *)(puVar21 + (long)(int)uVar46 * 4 + 4);
    uVar9 = *(undefined4 *)(puVar22 + (long)(int)uVar27 * 4);
    uVar10 = *(undefined4 *)(puVar22 + (long)(int)uVar36 * 4);
    uVar11 = *(undefined4 *)(puVar22 + (long)(int)uVar39 * 4);
    uVar12 = *(undefined4 *)(puVar22 + (long)(int)uVar46 * 4);
    uVar13 = *(undefined4 *)(puVar22 + (long)(int)uVar27 * 4 + 4);
    uVar14 = *(undefined4 *)(puVar22 + (long)(int)uVar36 * 4 + 4);
    uVar15 = *(undefined4 *)(puVar22 + (long)(int)uVar39 * 4 + 4);
    uVar16 = *(undefined4 *)(puVar22 + (long)(int)uVar46 * 4 + 4);
    local_678 = (ushort)local_818;
    uStack_676 = (ushort)((ulong)local_818 >> 0x10);
    uStack_674 = (ushort)((ulong)local_818 >> 0x20);
    uStack_670 = (ushort)uStack_810;
    uStack_66e = (ushort)((ulong)uStack_810 >> 0x10);
    uStack_66c = (ushort)((ulong)uStack_810 >> 0x20);
    local_888._2_2_ = uStack_676 >> 8;
    local_888._0_2_ = local_678 >> 8;
    local_888._4_2_ = uStack_674 >> 8;
    local_888._6_2_ = (ushort)((ulong)local_818 >> 0x38);
    local_888._8_2_ = uStack_670 >> 8;
    local_888._10_2_ = uStack_66e >> 8;
    local_888._12_2_ = uStack_66c >> 8;
    local_888._14_2_ = (ushort)((ulong)uStack_810 >> 0x38);
    iStack_124 = SUB84(local_888._0_8_,4);
    iStack_120 = local_888._8_4_;
    iStack_11c = local_888._12_4_;
    local_698 = (ushort)(local_888._0_4_ + 8);
    uStack_694 = (ushort)(iStack_124 + 8);
    uStack_690 = (ushort)(iStack_120 + 8);
    uStack_68c = (ushort)(iStack_11c + 8);
    local_888._2_2_ = (ushort)((uint)(local_888._0_4_ + 8) >> 0x14);
    local_888._0_2_ = local_698 >> 4;
    local_888._4_2_ = uStack_694 >> 4;
    local_888._6_2_ = (ushort)((uint)(iStack_124 + 8) >> 0x14);
    local_888._8_2_ = uStack_690 >> 4;
    local_888._10_2_ = (ushort)((uint)(iStack_120 + 8) >> 0x14);
    local_888._12_2_ = uStack_68c >> 4;
    local_888._14_2_ = (ushort)((uint)(iStack_11c + 8) >> 0x14);
    auVar32 = pshufhw(local_888,local_888,0xa0);
    auVar32 = pshuflw(auVar32,auVar32,0xa0);
    local_4d8 = auVar32._0_2_;
    sStack_4d6 = auVar32._2_2_;
    sStack_4d4 = auVar32._4_2_;
    sStack_4d2 = auVar32._6_2_;
    sStack_4d0 = auVar32._8_2_;
    sStack_4ce = auVar32._10_2_;
    sStack_4cc = auVar32._12_2_;
    sStack_4ca = auVar32._14_2_;
    local_4d8 = local_4d8 * local_798;
    sStack_4d6 = sStack_4d6 * local_798;
    sStack_4d4 = sStack_4d4 * local_798;
    sStack_4d2 = sStack_4d2 * local_798;
    sStack_4d0 = sStack_4d0 * local_798;
    sStack_4ce = sStack_4ce * local_798;
    sStack_4cc = sStack_4cc * local_798;
    sStack_4ca = sStack_4ca * local_798;
    auVar32 = psllw(auVar32,ZEXT416(4));
    auVar33 = psllw(auVar17,ZEXT416(4));
    local_3d8 = auVar32._0_2_;
    sStack_3d6 = auVar32._2_2_;
    sStack_3d4 = auVar32._4_2_;
    sStack_3d2 = auVar32._6_2_;
    sStack_3d0 = auVar32._8_2_;
    sStack_3ce = auVar32._10_2_;
    sStack_3cc = auVar32._12_2_;
    sStack_3ca = auVar32._14_2_;
    local_3e8 = auVar33._0_2_;
    sStack_3e6 = auVar33._2_2_;
    sStack_3e4 = auVar33._4_2_;
    sStack_3e2 = auVar33._6_2_;
    sStack_3e0 = auVar33._8_2_;
    sStack_3de = auVar33._10_2_;
    sStack_3dc = auVar33._12_2_;
    sStack_3da = auVar33._14_2_;
    sVar26 = local_4d8 + (0x100 - (local_3d8 + local_3e8));
    sVar34 = sStack_4d6 + (0x100 - (sStack_3d6 + sStack_3e6));
    sVar35 = sStack_4d4 + (0x100 - (sStack_3d4 + sStack_3e4));
    sVar37 = sStack_4d2 + (0x100 - (sStack_3d2 + sStack_3e2));
    sVar38 = sStack_4d0 + (0x100 - (sStack_3d0 + sStack_3e0));
    sVar44 = sStack_4ce + (0x100 - (sStack_3ce + sStack_3de));
    sVar45 = sStack_4cc + (0x100 - (sStack_3cc + sStack_3dc));
    sVar47 = sStack_4ca + (0x100 - (sStack_3ca + sStack_3da));
    local_6b8 = (ushort)uVar1;
    uStack_6b4 = (ushort)uVar2;
    uStack_6b0 = (ushort)uVar3;
    uStack_6ac = (ushort)uVar4;
    uVar28 = CONCAT44(uVar2,uVar1) & 0xff00ff00ff00ff;
    uVar40 = CONCAT44(uVar4,uVar3) & 0xff00ff00ff00ff;
    local_6d8 = (ushort)uVar5;
    uStack_6d4 = (ushort)uVar6;
    uStack_6d0 = (ushort)uVar7;
    uStack_6cc = (ushort)uVar8;
    uVar29 = CONCAT44(uVar6,uVar5) & 0xff00ff00ff00ff;
    uVar41 = CONCAT44(uVar8,uVar7) & 0xff00ff00ff00ff;
    local_6f8 = (ushort)uVar9;
    uStack_6f4 = (ushort)uVar10;
    uStack_6f0 = (ushort)uVar11;
    uStack_6ec = (ushort)uVar12;
    uVar30 = CONCAT44(uVar10,uVar9) & 0xff00ff00ff00ff;
    uVar42 = CONCAT44(uVar12,uVar11) & 0xff00ff00ff00ff;
    local_718 = (ushort)uVar13;
    uStack_714 = (ushort)uVar14;
    uStack_710 = (ushort)uVar15;
    uStack_70c = (ushort)uVar16;
    uVar31 = CONCAT44(uVar14,uVar13) & 0xff00ff00ff00ff;
    uVar43 = CONCAT44(uVar16,uVar15) & 0xff00ff00ff00ff;
    local_518 = (short)uVar28;
    sStack_516 = (short)(uVar28 >> 0x10);
    sStack_514 = (short)(uVar28 >> 0x20);
    sStack_512 = (short)(uVar28 >> 0x30);
    sStack_510 = (short)uVar40;
    sStack_50e = (short)(uVar40 >> 0x10);
    sStack_50c = (short)(uVar40 >> 0x20);
    sStack_50a = (short)(uVar40 >> 0x30);
    local_558 = (short)uVar29;
    sStack_556 = (short)(uVar29 >> 0x10);
    sStack_554 = (short)(uVar29 >> 0x20);
    sStack_552 = (short)(uVar29 >> 0x30);
    sStack_550 = (short)uVar41;
    sStack_54e = (short)(uVar41 >> 0x10);
    sStack_54c = (short)(uVar41 >> 0x20);
    sStack_54a = (short)(uVar41 >> 0x30);
    local_598 = (short)uVar30;
    sStack_596 = (short)(uVar30 >> 0x10);
    sStack_594 = (short)(uVar30 >> 0x20);
    sStack_592 = (short)(uVar30 >> 0x30);
    sStack_590 = (short)uVar42;
    sStack_58e = (short)(uVar42 >> 0x10);
    sStack_58c = (short)(uVar42 >> 0x20);
    sStack_58a = (short)(uVar42 >> 0x30);
    local_5d8 = (short)uVar31;
    sStack_5d6 = (short)(uVar31 >> 0x10);
    sStack_5d4 = (short)(uVar31 >> 0x20);
    sStack_5d2 = (short)(uVar31 >> 0x30);
    sStack_5d0 = (short)uVar43;
    sStack_5ce = (short)(uVar43 >> 0x10);
    sStack_5cc = (short)(uVar43 >> 0x20);
    sStack_5ca = (short)(uVar43 >> 0x30);
    local_978._0_4_ =
         CONCAT22((ushort)((uint)uVar1 >> 0x18) * sVar34 +
                  (ushort)((uint)uVar5 >> 0x18) * (sStack_3d6 - sStack_4d6) +
                  (ushort)((uint)uVar9 >> 0x18) * (sStack_3e6 - sStack_4d6) +
                  (ushort)((uint)uVar13 >> 0x18) * sStack_4d6,
                  (local_6b8 >> 8) * sVar26 + (local_6d8 >> 8) * (local_3d8 - local_4d8) +
                  (local_6f8 >> 8) * (local_3e8 - local_4d8) + (local_718 >> 8) * local_4d8);
    local_978 = CONCAT26((ushort)((uint)uVar2 >> 0x18) * sVar37 +
                         (ushort)((uint)uVar6 >> 0x18) * (sStack_3d2 - sStack_4d2) +
                         (ushort)((uint)uVar10 >> 0x18) * (sStack_3e2 - sStack_4d2) +
                         (ushort)((uint)uVar14 >> 0x18) * sStack_4d2,
                         CONCAT24((uStack_6b4 >> 8) * sVar35 +
                                  (uStack_6d4 >> 8) * (sStack_3d4 - sStack_4d4) +
                                  (uStack_6f4 >> 8) * (sStack_3e4 - sStack_4d4) +
                                  (uStack_714 >> 8) * sStack_4d4,(undefined4)local_978));
    uStack_970._0_4_ =
         CONCAT22((ushort)((uint)uVar3 >> 0x18) * sVar44 +
                  (ushort)((uint)uVar7 >> 0x18) * (sStack_3ce - sStack_4ce) +
                  (ushort)((uint)uVar11 >> 0x18) * (sStack_3de - sStack_4ce) +
                  (ushort)((uint)uVar15 >> 0x18) * sStack_4ce,
                  (uStack_6b0 >> 8) * sVar38 + (uStack_6d0 >> 8) * (sStack_3d0 - sStack_4d0) +
                  (uStack_6f0 >> 8) * (sStack_3e0 - sStack_4d0) + (uStack_710 >> 8) * sStack_4d0);
    uStack_970 = CONCAT26((ushort)((uint)uVar4 >> 0x18) * sVar47 +
                          (ushort)((uint)uVar8 >> 0x18) * (sStack_3ca - sStack_4ca) +
                          (ushort)((uint)uVar12 >> 0x18) * (sStack_3da - sStack_4ca) +
                          (ushort)((uint)uVar16 >> 0x18) * sStack_4ca,
                          CONCAT24((uStack_6ac >> 8) * sVar45 +
                                   (uStack_6cc >> 8) * (sStack_3cc - sStack_4cc) +
                                   (uStack_6ec >> 8) * (sStack_3dc - sStack_4cc) +
                                   (uStack_70c >> 8) * sStack_4cc,(undefined4)uStack_970));
    uStack_74 = (undefined4)(local_978 >> 0x20);
    uStack_6c = (undefined4)(uStack_970 >> 0x20);
    local_978 = CONCAT44(uStack_74,(undefined4)local_978) & 0xff00ff00ff00ff00;
    uStack_970 = CONCAT44(uStack_6c,(undefined4)uStack_970) & 0xff00ff00ff00ff00;
    local_988 = CONCAT26((ushort)(sStack_512 * sVar37 + sStack_552 * (sStack_3d2 - sStack_4d2) +
                                 sStack_592 * (sStack_3e2 - sStack_4d2) + sStack_5d2 * sStack_4d2)
                         >> 8,CONCAT24((ushort)(sStack_514 * sVar35 +
                                                sStack_554 * (sStack_3d4 - sStack_4d4) +
                                               sStack_594 * (sStack_3e4 - sStack_4d4) +
                                               sStack_5d4 * sStack_4d4) >> 8,
                                       CONCAT22((ushort)(sStack_516 * sVar34 +
                                                         sStack_556 * (sStack_3d6 - sStack_4d6) +
                                                        sStack_596 * (sStack_3e6 - sStack_4d6) +
                                                        sStack_5d6 * sStack_4d6) >> 8,
                                                (ushort)(local_518 * sVar26 +
                                                         local_558 * (local_3d8 - local_4d8) +
                                                        local_598 * (local_3e8 - local_4d8) +
                                                        local_5d8 * local_4d8) >> 8)));
    uStack_980 = CONCAT26((ushort)(sStack_50a * sVar47 + sStack_54a * (sStack_3ca - sStack_4ca) +
                                  sStack_58a * (sStack_3da - sStack_4ca) + sStack_5ca * sStack_4ca)
                          >> 8,CONCAT24((ushort)(sStack_50c * sVar45 +
                                                 sStack_54c * (sStack_3cc - sStack_4cc) +
                                                sStack_58c * (sStack_3dc - sStack_4cc) +
                                                sStack_5cc * sStack_4cc) >> 8,
                                        CONCAT22((ushort)(sStack_50e * sVar44 +
                                                          sStack_54e * (sStack_3ce - sStack_4ce) +
                                                         sStack_58e * (sStack_3de - sStack_4ce) +
                                                         sStack_5ce * sStack_4ce) >> 8,
                                                 (ushort)(sStack_510 * sVar38 +
                                                          sStack_550 * (sStack_3d0 - sStack_4d0) +
                                                         sStack_590 * (sStack_3e0 - sStack_4d0) +
                                                         sStack_5d0 * sStack_4d0) >> 8)));
    *local_758 = local_978 | local_988;
    local_758[1] = uStack_970 | uStack_980;
    local_818 = CONCAT44(uStack_2f4 + iVar20,local_2f8 + iVar20);
    uStack_810 = CONCAT44(uStack_2ec + iVar20,uStack_2f0 + iVar20);
  }
  *in_RCX = local_2f8;
  for (; local_758 < local_20; local_758 = (ulong *)((long)local_758 + 4)) {
    uVar18 = interpolate_4_pixels
                       ((uint *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),
                        (uint *)in_stack_fffffffffffff650,
                        (uint)((ulong)in_stack_fffffffffffff648 >> 0x20),
                        (uint)in_stack_fffffffffffff648);
    *(uint *)local_758 = uVar18;
    *in_RCX = in_R9D + *in_RCX;
  }
  for (; local_758 < in_RSI; local_758 = (ulong *)((long)local_758 + 4)) {
    local_34 = (int)*in_RCX >> 0x10;
    local_38 = -0x55555556;
    fetchTransformedBilinear_pixelBounds<(TextureBlendType)4>
              (in_RDX->width,in_RDX->x1,in_RDX->x2 + -1,&local_34,&local_38);
    uVar18 = interpolate_4_pixels
                       ((int)(*in_RCX & 0xffff) >> 8,in_stack_fffffffffffff658,
                        (uint)((ulong)in_stack_fffffffffffff650 >> 0x20),
                        (uint)in_stack_fffffffffffff650,
                        (uint)((ulong)in_stack_fffffffffffff648 >> 0x20),
                        (uint)in_stack_fffffffffffff648);
    *(uint *)local_758 = uVar18;
    *in_RCX = in_R9D + *in_RCX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void QT_FASTCALL fetchTransformedBilinearARGB32PM_downscale_helper(uint *b, uint *end, const QTextureData &image,
                                                                          int &fx, int &fy, int fdx, int /*fdy*/)
{
    int y1 = (fy >> 16);
    int y2;
    fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);
    const uint *s1 = (const uint *)image.scanLine(y1);
    const uint *s2 = (const uint *)image.scanLine(y2);
    const int disty8 = (fy & 0x0000ffff) >> 8;
    const int disty4 = (disty8 + 0x08) >> 4;

    if (blendType != BlendTransformedBilinearTiled) {
        const qint64 min_fx = qint64(image.x1) * fixed_scale;
        const qint64 max_fx = qint64(image.x2 - 1) * fixed_scale;
        while (b < end) {
            int x1 = (fx >> 16);
            int x2;
            fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
            if (x1 != x2)
                break;
            uint top = s1[x1];
            uint bot = s2[x1];
            *b = INTERPOLATE_PIXEL_256(top, 256 - disty8, bot, disty8);
            fx += fdx;
            ++b;
        }
        uint *boundedEnd = end;
        if (fdx > 0)
            boundedEnd = qMin(boundedEnd, b + (max_fx - fx) / fdx);
        else if (fdx < 0)
            boundedEnd = qMin(boundedEnd, b + (min_fx - fx) / fdx);
        // A fast middle part without boundary checks
#if defined(__SSE2__)
        const __m128i colorMask = _mm_set1_epi32(0x00ff00ff);
        const __m128i v_256 = _mm_set1_epi16(256);
        const __m128i v_disty = _mm_set1_epi16(disty4);
        const __m128i v_fdx = _mm_set1_epi32(fdx*4);
        const __m128i v_fx_r = _mm_set1_epi32(0x8);
        __m128i v_fx = _mm_setr_epi32(fx, fx + fdx, fx + fdx + fdx, fx + fdx + fdx + fdx);

        while (b < boundedEnd - 3) {
            __m128i offset = _mm_srli_epi32(v_fx, 16);
            const int offset0 = _mm_cvtsi128_si32(offset); offset = _mm_srli_si128(offset, 4);
            const int offset1 = _mm_cvtsi128_si32(offset); offset = _mm_srli_si128(offset, 4);
            const int offset2 = _mm_cvtsi128_si32(offset); offset = _mm_srli_si128(offset, 4);
            const int offset3 = _mm_cvtsi128_si32(offset);
            const __m128i tl = _mm_setr_epi32(s1[offset0], s1[offset1], s1[offset2], s1[offset3]);
            const __m128i tr = _mm_setr_epi32(s1[offset0 + 1], s1[offset1 + 1], s1[offset2 + 1], s1[offset3 + 1]);
            const __m128i bl = _mm_setr_epi32(s2[offset0], s2[offset1], s2[offset2], s2[offset3]);
            const __m128i br = _mm_setr_epi32(s2[offset0 + 1], s2[offset1 + 1], s2[offset2 + 1], s2[offset3 + 1]);

            __m128i v_distx = _mm_srli_epi16(v_fx, 8);
            v_distx = _mm_srli_epi16(_mm_add_epi32(v_distx, v_fx_r), 4);
            v_distx = _mm_shufflehi_epi16(v_distx, _MM_SHUFFLE(2,2,0,0));
            v_distx = _mm_shufflelo_epi16(v_distx, _MM_SHUFFLE(2,2,0,0));

            interpolate_4_pixels_16_sse2(tl, tr, bl, br, v_distx, v_disty, colorMask, v_256, b);
            b += 4;
            v_fx = _mm_add_epi32(v_fx, v_fdx);
        }
        fx = _mm_cvtsi128_si32(v_fx);
#elif defined(__ARM_NEON__)
        const int16x8_t colorMask = vdupq_n_s16(0x00ff);
        const int16x8_t invColorMask = vmvnq_s16(colorMask);
        const int16x8_t v_256 = vdupq_n_s16(256);
        const int16x8_t v_disty = vdupq_n_s16(disty4);
        const int16x8_t v_disty_ = vshlq_n_s16(v_disty, 4);
        int32x4_t v_fdx = vdupq_n_s32(fdx*4);

        int32x4_t v_fx = vmovq_n_s32(fx);
        v_fx = vsetq_lane_s32(fx + fdx, v_fx, 1);
        v_fx = vsetq_lane_s32(fx + fdx * 2, v_fx, 2);
        v_fx = vsetq_lane_s32(fx + fdx * 3, v_fx, 3);

        const int32x4_t v_ffff_mask = vdupq_n_s32(0x0000ffff);
        const int32x4_t v_fx_r = vdupq_n_s32(0x0800);

         // Pre-initialize to work-around code-analysis warnings/crashes in MSVC:
        uint32x4x2_t v_top = {};
        uint32x4x2_t v_bot = {};
        while (b < boundedEnd - 3) {
            int x1 = (fx >> 16);
            fx += fdx;
            v_top = vld2q_lane_u32(s1 + x1, v_top, 0);
            v_bot = vld2q_lane_u32(s2 + x1, v_bot, 0);
            x1 = (fx >> 16);
            fx += fdx;
            v_top = vld2q_lane_u32(s1 + x1, v_top, 1);
            v_bot = vld2q_lane_u32(s2 + x1, v_bot, 1);
            x1 = (fx >> 16);
            fx += fdx;
            v_top = vld2q_lane_u32(s1 + x1, v_top, 2);
            v_bot = vld2q_lane_u32(s2 + x1, v_bot, 2);
            x1 = (fx >> 16);
            fx += fdx;
            v_top = vld2q_lane_u32(s1 + x1, v_top, 3);
            v_bot = vld2q_lane_u32(s2 + x1, v_bot, 3);

            int32x4_t v_distx = vshrq_n_s32(vaddq_s32(vandq_s32(v_fx, v_ffff_mask), v_fx_r), 12);
            v_distx = vorrq_s32(v_distx, vshlq_n_s32(v_distx, 16));

            interpolate_4_pixels_16_neon(
                        vreinterpretq_s16_u32(v_top.val[0]), vreinterpretq_s16_u32(v_top.val[1]),
                    vreinterpretq_s16_u32(v_bot.val[0]), vreinterpretq_s16_u32(v_bot.val[1]),
                    vreinterpretq_s16_s32(v_distx), v_disty, v_disty_,
                    colorMask, invColorMask, v_256, b);
            b+=4;
            v_fx = vaddq_s32(v_fx, v_fdx);
        }
#elif defined (__loongarch_sx)
        const __m128i shuffleMask = (__m128i)(v8i16){0, 0, 2, 2, 4, 4, 6, 6};
        const __m128i v_disty = __lsx_vreplgr2vr_h(disty4);
        const __m128i v_fdx = __lsx_vreplgr2vr_w(fdx*4);
        const __m128i v_fx_r = __lsx_vreplgr2vr_w(0x8);
        __m128i v_fx = (__m128i)(v4i32){fx, fx + fdx, fx + fdx + fdx, fx + fdx + fdx + fdx};

        while (b < boundedEnd - 3) {
            __m128i offset = __lsx_vsrli_w(v_fx, 16);
            const int offset0 = __lsx_vpickve2gr_w(offset, 0);
            const int offset1 = __lsx_vpickve2gr_w(offset, 1);
            const int offset2 = __lsx_vpickve2gr_w(offset, 2);
            const int offset3 = __lsx_vpickve2gr_w(offset, 3);
            const __m128i tl = (__m128i)(v4u32){s1[offset0], s1[offset1], s1[offset2], s1[offset3]};
            const __m128i tr = (__m128i)(v4u32){s1[offset0 + 1], s1[offset1 + 1], s1[offset2 + 1], s1[offset3 + 1]};
            const __m128i bl = (__m128i)(v4u32){s2[offset0], s2[offset1], s2[offset2], s2[offset3]};
            const __m128i br = (__m128i)(v4u32){s2[offset0 + 1], s2[offset1 + 1], s2[offset2 + 1], s2[offset3 + 1]};

            __m128i v_distx = __lsx_vsrli_h(v_fx, 8);
            v_distx = __lsx_vsrli_h(__lsx_vadd_w(v_distx, v_fx_r), 4);
            v_distx = __lsx_vshuf_h(shuffleMask, v_distx, v_distx);

            interpolate_4_pixels_16_lsx(tl, tr, bl, br, v_distx, v_disty, b);
            b += 4;
            v_fx = __lsx_vadd_w(v_fx, v_fdx);
        }
        fx = __lsx_vpickve2gr_w(v_fx, 0);
#endif
        while (b < boundedEnd) {
            int x = (fx >> 16);
            if (hasFastInterpolate4()) {
                int distx8 = (fx & 0x0000ffff) >> 8;
                *b = interpolate_4_pixels(s1 + x, s2 + x, distx8, disty8);
            } else {
                int distx4 = ((fx & 0x0000ffff) + 0x0800) >> 12;
                *b = interpolate_4_pixels_16(s1[x], s1[x + 1], s2[x], s2[x + 1], distx4, disty4);
            }
            fx += fdx;
            ++b;
        }
    }

    while (b < end) {
        int x1 = (fx >> 16);
        int x2;
        fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
        uint tl = s1[x1];
        uint tr = s1[x2];
        uint bl = s2[x1];
        uint br = s2[x2];
        if (hasFastInterpolate4()) {
            int distx8 = (fx & 0x0000ffff) >> 8;
            *b = interpolate_4_pixels(tl, tr, bl, br, distx8, disty8);
        } else {
            int distx4 = ((fx & 0x0000ffff) + 0x0800) >> 12;
            *b = interpolate_4_pixels_16(tl, tr, bl, br, distx4, disty4);
        }
        fx += fdx;
        ++b;
    }
}